

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Line::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Line *this)

{
  uint32_t uVar1;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  SingleMthdTest *pSVar2;
  result_type rVar3;
  MthdNotify *this_00;
  MthdPatch *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdCtxClip *this_04;
  MthdCtxPattern *this_05;
  MthdCtxRop *this_06;
  MthdCtxBeta *this_07;
  MthdMissing *this_08;
  MthdOperation *this_09;
  MthdSolidFormat *this_10;
  MthdSolidColor *pMVar4;
  MthdVtxXy *pMVar5;
  MthdVtxX32 *pMVar6;
  MthdVtxY32 *pMVar7;
  MthdCtxSurf *this_11;
  MthdCtxSurf2D *this_12;
  allocator local_591;
  string local_590 [38];
  undefined1 local_56a;
  allocator local_569;
  string local_568 [32];
  SingleMthdTest *local_548;
  MthdCtxSurf2D *local_540;
  iterator local_538;
  undefined8 local_530;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_528;
  const_iterator local_520;
  SingleMthdTest **local_518;
  undefined1 local_50a;
  allocator local_509;
  string local_508 [32];
  MthdCtxSurf *local_4e8;
  MthdCtxSurf **local_4e0;
  undefined8 local_4d8;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_4d0;
  const_iterator local_4c8;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_4bb;
  undefined1 local_4ba;
  allocator local_4b9;
  string local_4b8 [38];
  undefined1 local_492;
  allocator local_491;
  string local_490 [38];
  undefined1 local_46a;
  allocator local_469;
  string local_468 [38];
  undefined1 local_442;
  allocator local_441;
  string local_440 [38];
  undefined1 local_41a;
  allocator local_419;
  string local_418 [38];
  undefined1 local_3f2;
  allocator local_3f1;
  string local_3f0 [38];
  undefined1 local_3ca;
  allocator local_3c9;
  string local_3c8 [38];
  undefined1 local_3a2;
  allocator local_3a1;
  string local_3a0 [38];
  undefined1 local_37a;
  allocator local_379;
  string local_378 [38];
  undefined1 local_352;
  allocator local_351;
  string local_350 [38];
  undefined1 local_32a;
  allocator local_329;
  string local_328 [38];
  undefined1 local_302;
  allocator local_301;
  string local_300 [38];
  undefined1 local_2da;
  allocator local_2d9;
  string local_2d8 [38];
  undefined1 local_2b2;
  allocator local_2b1;
  string local_2b0 [38];
  undefined1 local_28a;
  allocator local_289;
  string local_288 [38];
  undefined1 local_262;
  allocator local_261;
  string local_260 [38];
  undefined1 local_23a;
  allocator local_239;
  string local_238 [38];
  undefined1 local_212;
  allocator local_211;
  string local_210 [38];
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [38];
  undefined1 local_19a;
  allocator local_199;
  string local_198 [38];
  undefined1 local_172;
  allocator local_171;
  string local_170 [38];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [38];
  undefined1 local_122;
  allocator local_121;
  string local_120 [48];
  SingleMthdTest *local_f0;
  MthdNotify *local_e8;
  MthdPatch *local_e0;
  MthdPmTrigger *local_d8;
  MthdDmaNotify *local_d0;
  MthdCtxClip *local_c8;
  MthdCtxPattern *local_c0;
  MthdCtxRop *local_b8;
  MthdCtxBeta *local_b0;
  MthdMissing *local_a8;
  MthdOperation *local_a0;
  MthdSolidFormat *local_98;
  MthdSolidColor *local_90;
  MthdVtxXy *local_88;
  MthdVtxXy *local_80;
  MthdVtxX32 *local_78;
  MthdVtxY32 *local_70;
  MthdVtxX32 *local_68;
  MthdVtxY32 *local_60;
  MthdVtxXy *local_58;
  MthdVtxX32 *local_50;
  MthdVtxY32 *local_48;
  MthdSolidColor *local_40;
  MthdVtxXy *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Line *local_18;
  Line *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Line *)__return_storage_ptr__;
  pSVar2 = (SingleMthdTest *)operator_new(0x25950);
  local_122 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"nop",&local_121);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_120,-1,
             (this->super_Class).cls,0x100,1,4);
  local_122 = 0;
  local_f0 = pSVar2;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_14a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"notify",&local_149);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_148,0,
             (this->super_Class).cls,0x104,1,4);
  local_14a = 0;
  local_e8 = this_00;
  this_01 = (MthdPatch *)operator_new(0x25950);
  local_172 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"patch",&local_171);
  MthdPatch::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_170,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_172 = 0;
  local_e0 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_19a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"pm_trigger",&local_199);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_198,-1,
             (this->super_Class).cls,0x140,1,4);
  local_19a = 0;
  local_d8 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_1c2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"dma_notify",&local_1c1);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1c0,1,
             (this->super_Class).cls,0x180,1,4);
  local_1c2 = 0;
  local_d0 = this_03;
  this_04 = (MthdCtxClip *)operator_new(0x25950);
  local_1ea = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"ctx_clip",&local_1e9);
  MthdCtxClip::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1e8,2,
             (this->super_Class).cls,0x184,1,4);
  local_1ea = 0;
  local_c8 = this_04;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_212 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"ctx_pattern",&local_211);
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (this_05,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_210,3,uVar1,0x188,
             uVar1 != 0x1c);
  local_212 = 0;
  local_c0 = this_05;
  this_06 = (MthdCtxRop *)operator_new(0x25950);
  local_23a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"ctx_rop",&local_239);
  MthdCtxRop::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_238,4,
             (this->super_Class).cls,0x18c,1,4);
  local_23a = 0;
  local_b8 = this_06;
  this_07 = (MthdCtxBeta *)operator_new(0x25950);
  local_262 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"ctx_beta",&local_261);
  MthdCtxBeta::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_260,5,
             (this->super_Class).cls,400,1,4);
  local_262 = 0;
  local_b0 = this_07;
  this_08 = (MthdMissing *)operator_new(0x25950);
  local_28a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"missing",&local_289);
  MthdMissing::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_288,-1,
             (this->super_Class).cls,0x200,1,4);
  local_28a = 0;
  local_a8 = this_08;
  this_09 = (MthdOperation *)operator_new(0x25958);
  local_2b2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"operation",&local_2b1);
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (this_09,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2b0,8,uVar1,0x2fc,
             uVar1 != 0x1c);
  local_2b2 = 0;
  local_a0 = this_09;
  this_10 = (MthdSolidFormat *)operator_new(0x25958);
  local_2da = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"format",&local_2d9);
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (this_10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2d8,9,uVar1,0x300,
             uVar1 != 0x1c);
  local_2da = 0;
  local_98 = this_10;
  pMVar4 = (MthdSolidColor *)operator_new(0x25950);
  local_302 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_300,"color",&local_301);
  MthdSolidColor::SingleMthdTest
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_300,10,
             (this->super_Class).cls,0x304,1,4);
  local_302 = 0;
  local_90 = pMVar4;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_32a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_328,"line.0.xy",&local_329);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_328,0xb,
             (this->super_Class).cls,0x400,0x10,8,1);
  local_32a = 0;
  local_88 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_352 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"line.1.xy",&local_351);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_350,0xc,
             (this->super_Class).cls,0x404,0x10,8,4);
  local_352 = 0;
  local_80 = pMVar5;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_37a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"line32.0.x",&local_379);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_378,0xd,
             (this->super_Class).cls,0x480,8,0x10,1);
  local_37a = 0;
  local_78 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_3a2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"line32.0.y",&local_3a1);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3a0,0xe,
             (this->super_Class).cls,0x484,8,0x10,1);
  local_3a2 = 0;
  local_70 = pMVar7;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_3ca = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"line32.1.x",&local_3c9);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3c8,0xf,
             (this->super_Class).cls,0x488,8,0x10,4);
  local_3ca = 0;
  local_68 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_3f2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"line32.1.y",&local_3f1);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3f0,0x10,
             (this->super_Class).cls,0x48c,8,0x10,4);
  local_3f2 = 0;
  local_60 = pMVar7;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_41a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"polyline.xy",&local_419);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_418,0x11,
             (this->super_Class).cls,0x500,0x20,4,6);
  local_41a = 0;
  local_58 = pMVar5;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_442 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"polyline32.x",&local_441);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_440,0x12,
             (this->super_Class).cls,0x580,0x10,8,6);
  local_442 = 0;
  local_50 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_46a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"polyline32.y",&local_469);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_468,0x13,
             (this->super_Class).cls,0x584,0x10,8,6);
  local_46a = 0;
  local_48 = pMVar7;
  pMVar4 = (MthdSolidColor *)operator_new(0x25950);
  local_492 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"cpolyline.color",&local_491);
  MthdSolidColor::SingleMthdTest
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_490,0x14,
             (this->super_Class).cls,0x600,0x10,8);
  local_492 = 0;
  local_40 = pMVar4;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_4ba = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"cpolyline.xy",&local_4b9);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4b8,0x15,
             (this->super_Class).cls,0x604,0x10,8,6);
  local_4ba = 0;
  local_30 = &local_f0;
  local_28 = 0x18;
  local_38 = pMVar5;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_4bb);
  __l_01._M_len = local_28;
  __l_01._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_01,&local_4bb);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_4bb);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_379);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator((allocator<char> *)&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  if ((this->super_Class).cls == 0x1c) {
    local_4d0._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_4c8,&local_4d0);
    this_11 = (MthdCtxSurf *)operator_new(0x25958);
    local_50a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_508,"ctx_dst",&local_509);
    MthdCtxSurf::MthdCtxSurf
              (this_11,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_508,7,
               (this->super_Class).cls,0x194,0);
    local_50a = 0;
    local_4e0 = &local_4e8;
    local_4d8 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_4e0;
    local_4e8 = this_11;
    local_518 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_4c8,__l_00);
    std::__cxx11::string::~string(local_508);
    std::allocator<char>::~allocator((allocator<char> *)&local_509);
  }
  else {
    local_528._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_520,&local_528);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_56a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,"ctx_beta4",&local_569);
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_568,6
               ,(this->super_Class).cls,0x194,1,4);
    local_56a = 0;
    local_548 = pSVar2;
    this_12 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_590,"ctx_surf2d",&local_591);
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_12,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_590,7,
               (this->super_Class).cls,0x198,1);
    local_538 = &local_548;
    local_530 = 2;
    __l._M_len = 2;
    __l._M_array = local_538;
    local_540 = this_12;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_520,__l);
    std::__cxx11::string::~string(local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Line::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1c),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1c),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1c),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "line.0.xy", 11, cls, 0x400, 0x10, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "line.1.xy", 12, cls, 0x404, 0x10, 8, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "line32.0.x", 13, cls, 0x480, 8, 0x10, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "line32.0.y", 14, cls, 0x484, 8, 0x10, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "line32.1.x", 15, cls, 0x488, 8, 0x10, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "line32.1.y", 16, cls, 0x48c, 8, 0x10, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polyline.xy", 17, cls, 0x500, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polyline32.x", 18, cls, 0x580, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polyline32.y", 19, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolyline.color", 20, cls, 0x600, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolyline.xy", 21, cls, 0x604, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1c) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}